

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O2

UChar32 __thiscall
icu_63::FCDUTF16CollationIterator::nextCodePoint
          (FCDUTF16CollationIterator *this,UErrorCode *errorCode)

{
  UChar **ppUVar1;
  UChar UVar2;
  UBool UVar3;
  UChar *pUVar4;
  uint c;
  
  while (this->checkDir < '\x01') {
    if ((this->checkDir == '\0') &&
       (pUVar4 = (this->super_UTF16CollationIterator).pos,
       pUVar4 != (this->super_UTF16CollationIterator).limit)) goto LAB_0022163c;
    switchToForward(this);
  }
  pUVar4 = (this->super_UTF16CollationIterator).pos;
  c = 0xffffffff;
  if (pUVar4 != (this->super_UTF16CollationIterator).limit) {
    (this->super_UTF16CollationIterator).pos = pUVar4 + 1;
    UVar2 = *pUVar4;
    c = (uint)(ushort)UVar2;
    UVar3 = CollationFCD::hasTccc(c);
    if (UVar3 == '\0') {
      if (UVar2 == L'\0') {
        if ((this->super_UTF16CollationIterator).limit != (UChar *)0x0) {
          return 0;
        }
        pUVar4 = (this->super_UTF16CollationIterator).pos + -1;
        (this->super_UTF16CollationIterator).pos = pUVar4;
        this->rawLimit = pUVar4;
        (this->super_UTF16CollationIterator).limit = pUVar4;
        return -1;
      }
    }
    else if (((c & 0xff01) == 0xf01) ||
            ((pUVar4 = (this->super_UTF16CollationIterator).pos,
             pUVar4 != (this->super_UTF16CollationIterator).limit &&
             (UVar3 = CollationFCD::hasLccc((uint)(ushort)*pUVar4), UVar3 != '\0')))) {
      ppUVar1 = &(this->super_UTF16CollationIterator).pos;
      *ppUVar1 = *ppUVar1 + -1;
      UVar3 = nextSegment(this,errorCode);
      if (UVar3 == '\0') {
        return -1;
      }
      pUVar4 = (this->super_UTF16CollationIterator).pos;
LAB_0022163c:
      (this->super_UTF16CollationIterator).pos = pUVar4 + 1;
      c = (uint)(ushort)*pUVar4;
    }
    if ((((c & 0xfc00) == 0xd800) &&
        (pUVar4 = (this->super_UTF16CollationIterator).pos,
        pUVar4 != (this->super_UTF16CollationIterator).limit)) &&
       (UVar2 = *pUVar4, ((ushort)UVar2 & 0xfc00) == 0xdc00)) {
      (this->super_UTF16CollationIterator).pos = pUVar4 + 1;
      c = c * 0x400 + (uint)(ushort)UVar2 + 0xfca02400;
    }
  }
  return c;
}

Assistant:

UChar32
FCDUTF16CollationIterator::nextCodePoint(UErrorCode &errorCode) {
    UChar32 c;
    for(;;) {
        if(checkDir > 0) {
            if(pos == limit) {
                return U_SENTINEL;
            }
            c = *pos++;
            if(CollationFCD::hasTccc(c)) {
                if(CollationFCD::maybeTibetanCompositeVowel(c) ||
                        (pos != limit && CollationFCD::hasLccc(*pos))) {
                    --pos;
                    if(!nextSegment(errorCode)) {
                        return U_SENTINEL;
                    }
                    c = *pos++;
                }
            } else if(c == 0 && limit == NULL) {
                limit = rawLimit = --pos;
                return U_SENTINEL;
            }
            break;
        } else if(checkDir == 0 && pos != limit) {
            c = *pos++;
            break;
        } else {
            switchToForward();
        }
    }
    UChar trail;
    if(U16_IS_LEAD(c) && pos != limit && U16_IS_TRAIL(trail = *pos)) {
        ++pos;
        return U16_GET_SUPPLEMENTARY(c, trail);
    } else {
        return c;
    }
}